

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

bool __thiscall jpge::jpeg_encoder::process_scanline(jpeg_encoder *this,void *pScanline)

{
  bool bVar1;
  void *pScanline_local;
  jpeg_encoder *this_local;
  
  if ((this->m_pass_num == '\0') || (2 < this->m_pass_num)) {
    this_local._7_1_ = false;
  }
  else {
    if ((this->m_all_stream_writes_succeeded & 1U) != 0) {
      if (pScanline == (void *)0x0) {
        bVar1 = process_end_of_image(this);
        if (!bVar1) {
          return false;
        }
      }
      else {
        load_mcu(this,pScanline);
      }
    }
    this_local._7_1_ = (bool)(this->m_all_stream_writes_succeeded & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool jpeg_encoder::process_scanline(const void* pScanline)
	{
		if ((m_pass_num < 1) || (m_pass_num > 2)) return false;
		if (m_all_stream_writes_succeeded)
		{
			if (!pScanline)
			{
				if (!process_end_of_image()) return false;
			}
			else
			{
				load_mcu(pScanline);
			}
		}
		return m_all_stream_writes_succeeded;
	}